

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O2

string * QStringConverterICU::nul_terminate_abi_cxx11_(QAnyStringView name)

{
  string *in_RDI;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 local_21;
  QAnyStringView local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  QAnyStringView::
  visit<QStringConverterICU::nul_terminate[abi:cxx11](QAnyStringView)::_lambda(auto:1)_1_>
            (in_RDI,&local_20,&local_21);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static std::string nul_terminate(QAnyStringView name)
    { return name.visit([](auto name) { return nul_terminate_impl(name); }); }